

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOT<std::complex<double>_>::Serial_Assemble
          (TPZStructMatrixOT<std::complex<double>_> *this,TPZBaseMatrix *stiff_base,
          TPZBaseMatrix *rhs_base,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompEl *pTVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ostream *this_00;
  TPZAdmChunkVector<TPZCompEl_*,_10> *rhs_00;
  TPZEquationFilter *this_01;
  size_type sVar5;
  TPZCompMesh *pTVar6;
  TPZGuiInterface *this_02;
  TPZAutoPointer *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int matid;
  TPZSubCompMesh *submesh;
  TPZMaterial *mat;
  int matidsize;
  TPZCompEl *el;
  int64_t count;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elementvec;
  TPZTimer assemble;
  TPZTimer calcstiff;
  TPZElementMatrixT<std::complex<double>_> ef;
  TPZElementMatrixT<std::complex<double>_> ek;
  int64_t nelem;
  int64_t iel;
  TPZFMatrix<std::complex<double>_> *rhs;
  TPZMatrix<std::complex<double>_> *stiffness;
  set<int,_std::less<int>,_std::allocator<int>_> *materialIds;
  TPZEquationFilter *equationFilter;
  TPZCompMesh *cmesh;
  TPZStructMatrix *myself;
  string *in_stack_fffffffffffefa38;
  undefined6 in_stack_fffffffffffefa40;
  undefined1 in_stack_fffffffffffefa46;
  undefined1 in_stack_fffffffffffefa47;
  undefined4 in_stack_fffffffffffefa58;
  undefined2 in_stack_fffffffffffefa5c;
  undefined1 in_stack_fffffffffffefa5e;
  undefined1 in_stack_fffffffffffefa5f;
  undefined4 in_stack_fffffffffffefa60;
  undefined4 in_stack_fffffffffffefa64;
  long *plStack_10598;
  TPZCompEl *in_stack_fffffffffffefa70;
  TPZCompMesh *in_stack_fffffffffffefa78;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffefa80;
  TPZFMatrix<std::complex<double>_> *this_03;
  TPZStructMatrix *pTStack_10550;
  long lStack_10548;
  long lStack_10538;
  TPZElementMatrix *this_04;
  undefined1 auStack_104d9 [104];
  allocator<char> aStack_10471;
  string asStack_10470 [112];
  undefined1 auStack_10400 [600];
  size_t in_stack_fffffffffffefe58;
  char *in_stack_fffffffffffefe60;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffefe80;
  undefined1 local_8230 [248];
  undefined1 local_8138 [112];
  undefined1 local_80c8 [136];
  undefined1 local_8040 [16368];
  undefined1 local_4050 [16368];
  int64_t local_60;
  long local_58;
  long local_50;
  long *local_48;
  set<int,_std::less<int>,_std::allocator<int>_> *local_40;
  TPZEquationFilter *local_38;
  TPZCompMesh *local_30;
  TPZStructMatrix *local_28;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RSI == 0) {
    lStack_10538 = 0;
  }
  else {
    lStack_10538 = __dynamic_cast(in_RSI,&TPZBaseMatrix::typeinfo,
                                  &TPZMatrix<std::complex<double>>::typeinfo,0);
  }
  if (lStack_10538 != 0) {
    if (local_18 == 0) {
      lStack_10548 = 0;
    }
    else {
      lStack_10548 = __dynamic_cast(local_18,&TPZBaseMatrix::typeinfo,
                                    &TPZFMatrix<std::complex<double>>::typeinfo,0);
    }
    if (lStack_10548 != 0) goto LAB_01d87338;
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZStructMatrixOT<std::complex<double>>::Serial_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = std::complex<double>]"
                 );
  std::operator<<((ostream *)&std::cerr,": incompatible types. Aborting...\n");
  pzinternal::DebugStopImpl(in_stack_fffffffffffefe60,in_stack_fffffffffffefe58);
LAB_01d87338:
  if (in_RDI == (long *)0x0) {
    pTStack_10550 = (TPZStructMatrix *)0x0;
  }
  else {
    pTStack_10550 =
         (TPZStructMatrix *)
         __dynamic_cast(in_RDI,&TPZStructMatrixOT<std::complex<double>>::typeinfo,
                        &::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  }
  local_28 = pTStack_10550;
  local_30 = ::TPZStructMatrix::Mesh(pTStack_10550);
  local_38 = ::TPZStructMatrix::EquationFilter(local_28);
  local_40 = ::TPZStructMatrix::MaterialIds(local_28);
  local_48 = (long *)__dynamic_cast(local_10,&TPZBaseMatrix::typeinfo,
                                    &TPZMatrix<std::complex<double>>::typeinfo,0);
  if (local_48 == (long *)0x0) {
    __cxa_bad_cast();
  }
  local_50 = __dynamic_cast(local_18,&TPZBaseMatrix::typeinfo,
                            &TPZFMatrix<std::complex<double>>::typeinfo,0);
  if (local_50 == 0) {
    __cxa_bad_cast();
  }
  if (local_30 == (TPZCompMesh *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Serial_Assemble called without mesh");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_fffffffffffefe60,in_stack_fffffffffffefe58);
  }
  local_60 = TPZCompMesh::NElements((TPZCompMesh *)0x1d87487);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (in_stack_fffffffffffefa80,in_stack_fffffffffffefa78,
             (MType)((ulong)in_stack_fffffffffffefa70 >> 0x20));
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (in_stack_fffffffffffefa80,in_stack_fffffffffffefa78,
             (MType)((ulong)in_stack_fffffffffffefa70 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffefa80,(char *)in_stack_fffffffffffefa78,
             (allocator<char> *)in_stack_fffffffffffefa70);
  TPZTimer::TPZTimer((TPZTimer *)
                     CONCAT17(in_stack_fffffffffffefa47,
                              CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)),
                     in_stack_fffffffffffefa38);
  std::__cxx11::string::~string(asStack_10470);
  std::allocator<char>::~allocator(&aStack_10471);
  this_03 = (TPZFMatrix<std::complex<double>_> *)auStack_104d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffefa80,(char *)in_stack_fffffffffffefa78,
             (allocator<char> *)in_stack_fffffffffffefa70);
  TPZTimer::TPZTimer((TPZTimer *)
                     CONCAT17(in_stack_fffffffffffefa47,
                              CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)),
                     in_stack_fffffffffffefa38);
  std::__cxx11::string::~string((string *)(auStack_104d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)auStack_104d9);
  rhs_00 = TPZCompMesh::ElementVec(local_30);
  this_04 = (TPZElementMatrix *)0x0;
  for (local_58 = 0; local_58 < local_60; local_58 = local_58 + 1) {
    this_01 = (TPZEquationFilter *)
              TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)
                         CONCAT44(in_stack_fffffffffffefa64,in_stack_fffffffffffefa60),
                         CONCAT17(in_stack_fffffffffffefa5f,
                                  CONCAT16(in_stack_fffffffffffefa5e,
                                           CONCAT24(in_stack_fffffffffffefa5c,
                                                    in_stack_fffffffffffefa58))));
    pTVar1 = (TPZCompEl *)(this_01->super_TPZSavable)._vptr_TPZSavable;
    if (pTVar1 != (TPZCompEl *)0x0) {
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1d876ee);
      if ((int)sVar5 == 0) {
LAB_01d8781f:
        this_04 = (TPZElementMatrix *)((long)&this_04->_vptr_TPZElementMatrix + 1);
        if ((long)this_04 % 1000 == 0) {
          std::operator<<((ostream *)&std::cout,'*');
          std::ostream::flush();
        }
        if ((long)this_04 % 20000 == 0) {
          std::operator<<((ostream *)&std::cout,"\n");
        }
        TPZTimer::start((TPZTimer *)
                        CONCAT17(in_stack_fffffffffffefa47,
                                 CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)));
        (**(code **)(*(long *)pTVar1 + 0x110))(pTVar1,local_8230,auStack_10400);
        in_stack_fffffffffffefa5e = ::TPZAutoPointer::operator_cast_to_bool(in_RCX);
        if ((bool)in_stack_fffffffffffefa5e) {
          this_02 = TPZAutoPointer<TPZGuiInterface>::operator->
                              ((TPZAutoPointer<TPZGuiInterface> *)in_RCX);
          bVar3 = TPZGuiInterface::AmIKilled(this_02);
          if (bVar3) break;
        }
        TPZTimer::stop((TPZTimer *)
                       CONCAT17(in_stack_fffffffffffefa47,
                                CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)));
        TPZTimer::start((TPZTimer *)
                        CONCAT17(in_stack_fffffffffffefa47,
                                 CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)));
        iVar4 = (**(code **)(*(long *)pTVar1 + 0x1f0))();
        if (iVar4 == 0) {
          TPZElementMatrix::ComputeDestinationIndices(this_04);
          TPZEquationFilter::Filter
                    (this_01,(TPZVec<long> *)in_stack_fffffffffffefa78,
                     (TPZVec<long> *)in_stack_fffffffffffefa70);
          (**(code **)(*local_48 + 0x1a0))(local_48,local_8040,local_80c8,local_8138);
          in_stack_fffffffffffefa47 =
               TPZStrMatParInterface::ComputeRhs
                         ((TPZStrMatParInterface *)((long)in_RDI + *(long *)(*in_RDI + -0x60)));
          if ((bool)in_stack_fffffffffffefa47) {
            TPZFMatrix<std::complex<double>_>::AddFel
                      (this_03,(TPZFMatrix<std::complex<double>_> *)rhs_00,(TPZVec<long> *)this_01,
                       (TPZVec<long> *)in_stack_fffffffffffefa78);
          }
        }
        else {
          TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(in_stack_fffffffffffefe80);
          TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(in_stack_fffffffffffefe80);
          TPZElementMatrix::ComputeDestinationIndices(this_04);
          TPZEquationFilter::Filter
                    (this_01,(TPZVec<long> *)in_stack_fffffffffffefa78,
                     (TPZVec<long> *)in_stack_fffffffffffefa70);
          (**(code **)(*local_48 + 0x1a0))(local_48,local_4050,local_80c8,local_8138);
          in_stack_fffffffffffefa46 =
               TPZStrMatParInterface::ComputeRhs
                         ((TPZStrMatParInterface *)((long)in_RDI + *(long *)(*in_RDI + -0x60)));
          if ((bool)in_stack_fffffffffffefa46) {
            TPZFMatrix<std::complex<double>_>::AddFel
                      (this_03,(TPZFMatrix<std::complex<double>_> *)rhs_00,(TPZVec<long> *)this_01,
                       (TPZVec<long> *)in_stack_fffffffffffefa78);
          }
        }
        TPZTimer::stop((TPZTimer *)
                       CONCAT17(in_stack_fffffffffffefa47,
                                CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)));
      }
      else {
        pTVar6 = (TPZCompMesh *)(**(code **)(*(long *)pTVar1 + 0xb8))();
        in_stack_fffffffffffefa70 = pTVar1;
        in_stack_fffffffffffefa78 = pTVar6;
        if (pTVar1 == (TPZCompEl *)0x0) {
          plStack_10598 = (long *)0x0;
        }
        else {
          plStack_10598 =
               (long *)__dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
        }
        if (pTVar6 == (TPZCompMesh *)0x0) {
          if (plStack_10598 != (long *)0x0) {
            bVar2 = (**(code **)(*plStack_10598 + 0x140))(plStack_10598,local_40);
            in_stack_fffffffffffefa64 = CONCAT13(bVar2,(int3)in_stack_fffffffffffefa64);
            if ((bVar2 & 1) != 0) goto LAB_01d8781f;
          }
        }
        else {
          in_stack_fffffffffffefa60 = (**(code **)(*(long *)pTVar6 + 0x58))();
          in_stack_fffffffffffefa5f =
               ::TPZStructMatrix::ShouldCompute
                         ((TPZStructMatrix *)
                          CONCAT44(in_stack_fffffffffffefa64,in_stack_fffffffffffefa60),
                          CONCAT13(in_stack_fffffffffffefa5f,
                                   CONCAT12(in_stack_fffffffffffefa5e,in_stack_fffffffffffefa5c)));
          if ((bool)in_stack_fffffffffffefa5f) goto LAB_01d8781f;
        }
      }
    }
  }
  TPZTimer::~TPZTimer((TPZTimer *)0x1d87b33);
  TPZTimer::~TPZTimer((TPZTimer *)0x1d87b40);
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT
            ((TPZElementMatrixT<std::complex<double>_> *)
             CONCAT17(in_stack_fffffffffffefa47,
                      CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)));
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT
            ((TPZElementMatrixT<std::complex<double>_> *)
             CONCAT17(in_stack_fffffffffffefa47,
                      CONCAT16(in_stack_fffffffffffefa46,in_stack_fffffffffffefa40)));
  return;
}

Assistant:

void TPZStructMatrixOT<TVar>::Serial_Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface ){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base)||
       !dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<": incompatible types. Aborting...\n";
        DebugStop();
    }
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    auto *cmesh = myself->Mesh();
    const auto &equationFilter = myself->EquationFilter();
    auto &materialIds = myself->MaterialIds();
    
    auto &stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto &rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
    if(!cmesh){
        LOGPZ_ERROR(logger,"Serial_Assemble called without mesh")
        DebugStop();
    }
#ifdef PZ_LOG
    if(dynamic_cast<TPZSubCompMesh * >(cmesh))
    {
        std::stringstream sout;
        sout << "AllEig = {};";
        LOGPZ_DEBUG(loggerelmat,sout.str())
        
    }
#endif
#ifdef PZDEBUG
    if (ComputeRhs() && rhs.Rows() != equationFilter.NActiveEquations()) {
        DebugStop();
    }
#endif
    
    int64_t iel;
    int64_t nelem = cmesh->NElements();
    TPZElementMatrixT<TVar> ek(cmesh, TPZElementMatrix::EK),ef(cmesh, TPZElementMatrix::EF);
#ifdef PZ_LOG
    bool globalresult = true;
    bool writereadresult = true;
#endif
    TPZTimer calcstiff("Computing the stiffness matrices");
    TPZTimer assemble("Assembling the stiffness matrices");
    TPZAdmChunkVector<TPZCompEl *> &elementvec = cmesh->ElementVec();
    
    int64_t count = 0;
    for(iel=0; iel < nelem; iel++) {
        TPZCompEl *el = elementvec[iel];
        if(!el) continue;
        int matidsize = materialIds.size();
        if(matidsize){
            TPZMaterial * mat = el->Material();
            TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            if (!mat)
            {
                if (!submesh) {
                    continue;
                }
                else if(submesh->NeedsComputing(materialIds) == false) continue;
            }
            else
            {
                int matid = mat->Id();
                if (myself->ShouldCompute(matid) == false) continue;
            }
        }
        
        count++;
        if(!(count%1000))
        {
            std::cout << '*';
            std::cout.flush();
        }
        if(!(count%20000))
        {
            std::cout << "\n";
        }
        calcstiff.start();
        
        el->CalcStiff(ek,ef);
        
        if(guiInterface) if(guiInterface->AmIKilled()){
            return;
        }
        
#ifdef PZ_LOG
        if(dynamic_cast<TPZSubCompMesh * >(cmesh))
        {
            std::stringstream objname;
            objname << "Element" << iel;
            std::string name = objname.str();
            objname << " = ";
            std::stringstream sout;
            ek.fMat.Print(objname.str().c_str(),sout,EMathematicaInput);
            sout << "AppendTo[AllEig,Eigenvalues[" << name << "]];";
            
            LOGPZ_DEBUG(loggerelmat,sout.str())
            /*		  if(iel == 133)
             {
             std::stringstream sout2;
             el->Reference()->Print(sout2);
             el->Print(sout2);
             LOGPZ_DEBUG(logger,sout2.str())
             }
             */
        }
        
#endif
        
#ifdef CHECKCONSISTENCY
        //extern TPZCheckConsistency stiffconsist("ElementStiff");
        stiffconsist.SetOverWrite(true);
        bool result;
        result = stiffconsist.CheckObject(ek.fMat);
        if(!result)
        {
            globalresult = false;
            std::stringstream sout;
            sout << "element " << iel << " computed differently";
            LOGPZ_ERROR(loggerCheck,sout.str())
        }
        
#endif
        
        calcstiff.stop();
        assemble.start();
        
        if(!el->HasDependency()) {
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            //			TPZSFMatrix<TVar> test(stiffness);
            //			TPZFMatrix<TVar> test2(stiffness.Rows(),stiffness.Cols(),0.);
            //			stiffness.Print("before assembly",std::cout,EMathematicaInput);
            stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			stiffness.Print("stiffness after assembly STK = ",std::cout,EMathematicaInput);
            //			rhs.Print("rhs after assembly Rhs = ",std::cout,EMathematicaInput);
            //			test2.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			test -= stiffness;
            //			test.Print("matriz de rigidez diference",std::cout);
            //			test2.Print("matriz de rigidez interface",std::cout);
            
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled())
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                if(gel)
                {
                    TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                    gel->CenterPoint(gel->NSides()-1, center);
                    gel->X(center, xcenter);
                    sout << "Stiffness for computational element index " << el->Index() << std::endl;
                    sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                }
                else {
                    sout << "Stiffness for computational element without associated geometric element\n";
                }
                ek.Print(sout);
                if(ComputeRhs())ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            ek.ApplyConstraints();
            ef.ApplyConstraints();
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled() && ! dynamic_cast<TPZSubCompMesh *>(cmesh))
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                gel->CenterPoint(gel->NSides()-1, center);
                gel->X(center, xcenter);
                sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                ek.Print(sout);
                ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        }
        
        assemble.stop();
    }//fim for iel
    
#ifdef PZ_LOG
    if(loggerCheck.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "The comparaison results are : consistency check " << globalresult << " write read check " << writereadresult;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        stiffness.Print("Matriz de Rigidez: ",sout,EMathematicaInput);
        if(ComputeRhs()) rhs.Print("Right Handside", sout,EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck,sout.str())
    }
    
#endif
    
}